

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> __thiscall
pbrt::Tokenizer::CreateFromFile
          (Tokenizer *this,string *filename,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  int iVar3;
  int iVar4;
  Tokenizer *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  string ret_2;
  string str;
  void *ptr;
  size_t len;
  stat stat;
  _Any_data local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  FileLoc *local_d8;
  void *local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  pointer local_90;
  
  if (LOGGING_LogLevel < 1) {
    local_c0._8_8_ = 0;
    local_b0[0]._M_allocated_capacity = local_b0[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_c0._0_8_ = local_b0;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              ((string *)local_c0,"Creating Tokenizer for %s",filename);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
        ,0x79,(char *)local_c0._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0]._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)filename);
  if (iVar3 == 0) {
    paVar1 = &local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_100._M_dataplus._M_p = (pointer)paVar1;
    while (iVar3 = getchar(), iVar3 != -1) {
      std::__cxx11::string::push_back('\0');
    }
    this_00 = (Tokenizer *)operator_new(0x98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar1) {
      local_b0[0]._8_8_ = local_100.field_2._8_8_;
      local_c0._0_8_ = local_b0;
    }
    else {
      local_c0._0_8_ = local_100._M_dataplus._M_p;
    }
    local_b0[0]._M_allocated_capacity._1_7_ = local_100.field_2._M_allocated_capacity._1_7_;
    local_b0[0]._M_local_buf[0] = local_100.field_2._M_local_buf[0];
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    local_c0._8_8_ = local_100._M_string_length;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_118._M_allocated_capacity = 0;
    local_118._8_8_ = errorCallback->_M_invoker;
    p_Var2 = (errorCallback->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_128._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(errorCallback->super__Function_base)._M_functor;
      local_128._8_8_ = *(undefined8 *)((long)&(errorCallback->super__Function_base)._M_functor + 8)
      ;
      (errorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
      errorCallback->_M_invoker = (_Invoker_type)0x0;
      local_118._M_allocated_capacity = (size_type)p_Var2;
    }
    local_100._M_dataplus._M_p = (pointer)paVar1;
    Tokenizer(this_00,(string *)local_c0,
              (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_128);
    (this->loc).filename._M_len = (size_t)this_00;
    if ((_Manager_type)local_118._M_allocated_capacity != (_Manager_type)0x0) {
      (*(code *)local_118._M_allocated_capacity)(&local_128,&local_128,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar1) {
      return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
             (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
             this;
    }
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
    return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
           (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)this;
  }
  iVar3 = open((filename->_M_dataplus)._M_p,0);
  if (iVar3 == -1) {
    LastError();
    ErrorString_abi_cxx11_(0);
    local_c0._8_8_ = 0;
    local_b0[0]._M_allocated_capacity = local_b0[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_c0._0_8_ = local_b0;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string>
              ((string *)local_c0,"%s: %s",filename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128);
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    local_100._M_dataplus._M_p = (pointer)local_c0._0_8_;
    if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*errorCallback->_M_invoker)
              ((_Any_data *)errorCallback,(char **)&local_100,(FileLoc **)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0]._M_allocated_capacity + 1);
    }
    uVar5 = local_118._M_allocated_capacity;
    uVar6 = local_128._M_unused._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_unused._0_8_ == &local_118) goto LAB_0027f190;
  }
  else {
    iVar4 = fstat(iVar3,(stat *)local_c0);
    if (iVar4 == 0) {
      local_c8 = (undefined1  [8])local_90;
      local_d0 = mmap((void *)0x0,(size_t)local_90,1,1,iVar3,0);
      iVar3 = close(iVar3);
      if (iVar3 == 0) {
        std::
        make_unique<pbrt::Tokenizer,void*&,unsigned_long&,std::__cxx11::string_const&,std::function<void(char_const*,pbrt::FileLoc_const*)>>
                  ((void **)this,(unsigned_long *)&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)filename);
        return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
               (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
               this;
      }
      LastError();
      ErrorString_abi_cxx11_(0);
      local_128._M_unused._M_object = &local_118;
      local_128._8_8_ = 0;
      local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
      detail::stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string>
                ((string *)&local_128,"%s: %s",filename,&local_100);
      local_d8 = (FileLoc *)0x0;
      local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_128._M_unused._0_8_;
      if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*errorCallback->_M_invoker)((_Any_data *)errorCallback,(char **)&local_e0,&local_d8);
    }
    else {
      LastError();
      ErrorString_abi_cxx11_(0);
      local_128._M_unused._M_object = &local_118;
      local_128._8_8_ = 0;
      local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
      detail::stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string>
                ((string *)&local_128,"%s: %s",filename,&local_100);
      local_d8 = (FileLoc *)0x0;
      local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_128._M_unused._0_8_;
      if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*errorCallback->_M_invoker)((_Any_data *)errorCallback,(char **)&local_e0,&local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_unused._0_8_ != &local_118) {
      operator_delete(local_128._M_unused._M_object,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0027f190;
    uVar5 = CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,local_100.field_2._M_local_buf[0]
                    );
    uVar6 = local_100._M_dataplus._M_p;
  }
  operator_delete((void *)uVar6,uVar5 + 1);
LAB_0027f190:
  (this->loc).filename._M_len = 0;
  return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
         (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Tokenizer> Tokenizer::CreateFromFile(
    const std::string &filename,
    std::function<void(const char *, const FileLoc *)> errorCallback) {
    LOG_VERBOSE("Creating Tokenizer for %s", filename);
    if (filename == "-") {
        // Handle stdin by slurping everything into a string.
        std::string str;
        int ch;
        while ((ch = getchar()) != EOF)
            str.push_back((char)ch);
        return std::make_unique<Tokenizer>(std::move(str), std::move(errorCallback));
    }

#ifdef PBRT_HAVE_MMAP
    int fd = open(filename.c_str(), O_RDONLY);
    if (fd == -1) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    struct stat stat;
    if (fstat(fd, &stat) != 0) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    size_t len = stat.st_size;
    void *ptr = mmap(nullptr, len, PROT_READ, MAP_FILE | MAP_SHARED, fd, 0);
    if (close(fd) != 0) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    return std::make_unique<Tokenizer>(ptr, len, filename, std::move(errorCallback));
#elif defined(PBRT_IS_WINDOWS)
    auto errorReportLambda = [&errorCallback, &filename]() -> std::unique_ptr<Tokenizer> {
        LPSTR messageBuffer = nullptr;
        FormatMessageA(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
                           FORMAT_MESSAGE_IGNORE_INSERTS,
                       NULL, ::GetLastError(), MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                       (LPSTR)&messageBuffer, 0, NULL);

        errorCallback(StringPrintf("%s: %s", filename, messageBuffer).c_str(), nullptr);

        LocalFree(messageBuffer);
        return nullptr;
    };

    HANDLE fileHandle = CreateFileA(filename.c_str(), GENERIC_READ, FILE_SHARE_READ, 0,
                                    OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, 0);
    if (!fileHandle) {
        return errorReportLambda();
    }

    size_t len = GetFileSize(fileHandle, 0);

    HANDLE mapping = CreateFileMapping(fileHandle, 0, PAGE_READONLY, 0, 0, 0);
    CloseHandle(fileHandle);
    if (mapping == 0) {
        return errorReportLambda();
    }

    LPVOID ptr = MapViewOfFile(mapping, FILE_MAP_READ, 0, 0, 0);
    CloseHandle(mapping);
    if (ptr == nullptr) {
        return errorReportLambda();
    }

    std::string str(static_cast<const char *>(ptr), len);

    return std::make_unique<Tokenizer>(ptr, len, filename, std::move(errorCallback));
#else
    FILE *f = fopen(filename.c_str(), "r");
    if (!f) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    std::string str;
    int ch;
    while ((ch = fgetc(f)) != EOF)
        str.push_back(char(ch));
    fclose(f);
    return std::make_unique_ptr<Tokenizer>(std::move(str), std::move(errorCallback));
#endif
}